

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.h
# Opt level: O2

bool google::protobuf::MathUtil::WithinFractionOrMargin<float>
               (float x,float y,float fraction,float margin)

{
  bool bVar1;
  float fVar2;
  LogMessage *other;
  float fVar3;
  undefined1 in_register_00001204 [12];
  undefined4 in_XMM1_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  LogMessage local_80;
  float local_48;
  undefined4 uStack_44;
  float local_38;
  undefined1 local_28 [16];
  float local_18;
  LogFinisher local_11;
  
  local_28._4_12_ = in_register_00001204;
  local_28._0_4_ = x;
  if (((fraction < 0.0) || (1.0 <= fraction)) || (margin < 0.0)) {
    local_48 = y;
    uStack_44 = in_XMM1_Db;
    local_38 = margin;
    local_18 = fraction;
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/mathutil.h"
               ,0x8e);
    other = internal::LogMessage::operator<<
                      (&local_80,
                       "CHECK failed: (T(0) < fraction || T(0) == fraction) && fraction < T(1) && margin >= T(0): "
                      );
    internal::LogFinisher::operator=(&local_11,other);
    internal::LogMessage::~LogMessage(&local_80);
    fraction = local_18;
    margin = local_38;
    y = local_48;
    in_XMM1_Db = uStack_44;
  }
  fVar2 = (float)local_28._0_8_;
  if ((uint)ABS(fVar2) < 0x7f800000 && (uint)ABS(y) < 0x7f800000) {
    auVar4._8_4_ = (int)((ulong)local_28._0_8_ >> 0x20);
    auVar4._0_8_ = local_28._0_8_;
    auVar4._12_4_ = in_XMM1_Db;
    auVar5._8_8_ = auVar4._8_8_;
    auVar5._4_4_ = y;
    auVar5._0_4_ = fVar2;
    auVar5 = maxps(auVar5,_DAT_0035dbc0 ^ auVar5);
    fVar6 = auVar5._0_4_;
    fVar3 = fVar6;
    if (fVar6 <= auVar5._4_4_) {
      fVar3 = auVar5._4_4_;
    }
    fVar6 = (float)(~-(uint)NAN(fVar6) & (uint)fVar3 | -(uint)NAN(fVar6) & (uint)fVar6) * fraction;
    fVar3 = margin;
    if (margin <= fVar6) {
      fVar3 = fVar6;
    }
    bVar1 = (float)(~-(uint)(y < fVar2) & (uint)(y - fVar2) | (uint)(fVar2 - y) & -(uint)(y < fVar2)
                   ) <=
            (float)(-(uint)NAN(margin) & (uint)margin | ~-(uint)NAN(margin) & (uint)fVar3);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MathUtil::WithinFractionOrMargin(const T x, const T y,
                                      const T fraction, const T margin) {
  // Not just "0 <= fraction" to fool the compiler for unsigned types.
  GOOGLE_DCHECK((T(0) < fraction || T(0) == fraction) &&
         fraction < T(1) &&
         margin >= T(0));

  // Template specialization will convert the if() condition to a constant,
  // which will cause the compiler to generate code for either the "if" part
  // or the "then" part.  In this way we avoid a compiler warning
  // about a potential integer overflow in crosstool v12 (gcc 4.3.1).
  if (std::numeric_limits<T>::is_integer) {
    return x == y;
  } else {
    if (!std::isfinite(x) || !std::isfinite(y)) {
      return false;
    }
    T relative_margin = static_cast<T>(fraction * Max(Abs(x), Abs(y)));
    return AbsDiff(x, y) <= Max(margin, relative_margin);
  }
}